

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::BinaryBlockEventExpressionSyntax::setChild
          (BinaryBlockEventExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffff98;
  BlockEventExpressionSyntax *local_60;
  BlockEventExpressionSyntax *local_40;
  not_null<slang::syntax::BlockEventExpressionSyntax_*> local_38;
  undefined8 local_30;
  Info *local_28;
  BlockEventExpressionSyntax *local_20;
  not_null<slang::syntax::BlockEventExpressionSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6b1aff);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_60 = (BlockEventExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6b1b0f);
      local_60 = SyntaxNode::as<slang::syntax::BlockEventExpressionSyntax>(pSVar1);
    }
    local_20 = local_60;
    not_null<slang::syntax::BlockEventExpressionSyntax_*>::
    not_null<slang::syntax::BlockEventExpressionSyntax_*>(local_18,&local_20);
    *(BlockEventExpressionSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else if (in_RSI == 1) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x20) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x28) = local_28;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6b1b8d);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_40 = (BlockEventExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6b1b9d);
      local_40 = SyntaxNode::as<slang::syntax::BlockEventExpressionSyntax>(pSVar1);
    }
    not_null<slang::syntax::BlockEventExpressionSyntax_*>::
    not_null<slang::syntax::BlockEventExpressionSyntax_*>(&local_38,&local_40);
    *(BlockEventExpressionSyntax **)(in_RDI + 0x30) = local_38.ptr;
  }
  return;
}

Assistant:

void BinaryBlockEventExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<BlockEventExpressionSyntax>() : nullptr; return;
        case 1: orKeyword = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<BlockEventExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}